

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommands.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  long lVar1;
  App *this;
  App *this_00;
  ostream *poVar2;
  _Alloc_hider _Var3;
  string file;
  App app;
  char local_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  string local_550;
  undefined1 *local_530;
  long local_528;
  undefined1 local_520 [16];
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  App local_390;
  
  local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"K3Pi goofit fitter","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"");
  CLI::App::App(&local_390,&local_3b0,&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  local_530 = local_520;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"--help-all","");
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"Expand all help","");
  if (local_390.help_all_ptr_ != (Option *)0x0) {
    CLI::App::remove_option(&local_390,local_390.help_all_ptr_);
    local_390.help_all_ptr_ = (Option *)0x0;
  }
  if (local_528 != 0) {
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_550,local_530,local_530 + local_528);
    local_390.help_all_ptr_ =
         CLI::App::
         add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                   (&local_390,&local_550,&local_570);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p);
    }
    ((local_390.help_all_ptr_)->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if (local_530 != local_520) {
    operator_delete(local_530);
  }
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"--random","");
  CLI::App::add_flag<const_char[17],_(CLI::detail::enabler)0>
            (&local_390,&local_3f0,(char (*) [17])"Some random flag");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"start","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"A great subcommand","");
  this = CLI::App::add_subcommand(&local_390,&local_410,&local_430);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"stop","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"Do you really want to stop?","");
  this_00 = CLI::App::add_subcommand(&local_390,&local_450,&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  local_390.require_subcommand_min_ = 1;
  local_390.require_subcommand_max_ = 0;
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  local_550._M_string_length = 0;
  local_550.field_2._M_local_buf[0] = '\0';
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"-f,--file","");
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,"File name","");
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this,&local_490,&local_550,&local_4b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p);
  }
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"-c,--count","");
  CLI::App::add_flag<const_char[8],_(CLI::detail::enabler)0>
            (this_00,&local_4d0,(char (*) [8])"Counter");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p);
  }
  CLI::App::parse_char_t<char>(&local_390,argc,argv);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Working on --file from start: ",0x1e);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_550._M_dataplus._M_p,local_550._M_string_length);
  local_570._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_570,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Working on --count from stop: ",0x1e);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", direct count: ",0x10);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"--count","");
  CLI::App::count(this_00,&local_4f0);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_570._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_570,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Count of --random flag: ",0x18);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"--random","");
  CLI::App::count(&local_390,&local_510);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_570._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_570,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p);
  }
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_570,
             &local_390.parsed_subcommands_);
  if (local_570._M_dataplus._M_p != (pointer)local_570._M_string_length) {
    _Var3._M_p = local_570._M_dataplus._M_p;
    do {
      lVar1 = *(long *)_Var3._M_p;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Subcommand: ",0xc);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,*(char **)(lVar1 + 8),*(long *)(lVar1 + 0x10));
      local_571 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_571,1);
      _Var3._M_p = _Var3._M_p + 8;
    } while (_Var3._M_p != (pointer)local_570._M_string_length);
  }
  if ((long *)local_570._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p);
  }
  CLI::App::~App(&local_390);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");
    app.set_help_all_flag("--help-all", "Expand all help");
    app.add_flag("--random", "Some random flag");
    CLI::App *start = app.add_subcommand("start", "A great subcommand");
    CLI::App *stop = app.add_subcommand("stop", "Do you really want to stop?");
    app.require_subcommand();  // 1 or more

    std::string file;
    start->add_option("-f,--file", file, "File name");

    CLI::Option *s = stop->add_flag("-c,--count", "Counter");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on --file from start: " << file << '\n';
    std::cout << "Working on --count from stop: " << s->count() << ", direct count: " << stop->count("--count") << '\n';
    std::cout << "Count of --random flag: " << app.count("--random") << '\n';
    for(auto *subcom : app.get_subcommands())
        std::cout << "Subcommand: " << subcom->get_name() << '\n';

    return 0;
}